

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::DescriptorProto::IsInitialized(DescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                    (&this->field_);
  if ((((bVar1) &&
       (bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                          (&this->nested_type_), bVar1)) &&
      (bVar1 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                         (&this->enum_type_), bVar1)) &&
     (((bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                          (&this->extension_), bVar1 &&
       (bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>>
                          (&this->oneof_decl_), bVar1)) &&
      ((((this->_has_bits_).has_bits_[0] & 2) == 0 ||
       (bVar1 = MessageOptions::IsInitialized(this->options_), bVar1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool DescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->field())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->nested_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->oneof_decl())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}